

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  lock_guard<std::mutex> iolock;
  pointer ptVar5;
  int iVar6;
  code *__f;
  ulong uVar7;
  ulong uVar8;
  int local_fc;
  WorkloadFunc func;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  reference_wrapper<float> local_a0;
  reference_wrapper<const_std::vector<float,_std::allocator<float>_>_> local_98;
  thread local_90;
  locale local_88 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  inputs;
  vector<float,_std::allocator<float>_> results;
  string workload_name;
  
  std::locale::locale((locale *)&func,"");
  std::ios::imbue(local_88);
  std::locale::~locale(local_88);
  std::locale::~locale((locale *)&func);
  iVar6 = (int)((long)argc / 2);
  std::vector<float,_std::allocator<float>_>::vector(&results,(long)iVar6,(allocator_type *)&func);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&threads,(long)iVar6,(allocator_type *)&func);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&inputs,(long)(iVar6 + 1),(allocator_type *)&func);
  uVar7 = 0;
  uVar8 = (long)argc / 2 & 0xffffffff;
  if (iVar6 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
    make_input_array((vector<float,_std::allocator<float>_> *)&func,100000000);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              ((vector<float,_std::allocator<float>_> *)
               ((long)&((inputs.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar7),&func);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&func);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Created ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6 + 1);
  poVar3 = std::operator<<(poVar3," input arrays");
  std::operator<<(poVar3,"; elapsed: ");
  lVar4 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar4 - lVar2) / 1000000.0);
  std::operator<<(poVar3," ms\n");
  local_fc = 0;
  uVar8 = 1;
  do {
    ptVar5 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)argc <= (long)uVar8) goto LAB_00103320;
    func.super__Function_base._M_manager = (_Manager_type)0x0;
    func._M_invoker = (_Invoker_type)0x0;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    func.super__Function_base._M_functor._8_8_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&workload_name,argv[uVar8],(allocator<char> *)&local_90);
    bVar1 = std::operator==(&workload_name,"fpchurn");
    __f = workload_fpchurn;
    if (bVar1) {
LAB_001031b8:
      std::function<void(std::vector<float,std::allocator<float>>const&,float&)>::operator=
                ((function<void(std::vector<float,std::allocator<float>>const&,float&)> *)&func,__f)
      ;
      iVar6 = 0;
      if ((int)uVar8 + 1 < argc) {
        iVar6 = atoi(argv[uVar8 + 1]);
      }
      std::mutex::lock(&iomutex);
      poVar3 = std::operator<<((ostream *)&std::cout,"Spawning workload \'");
      poVar3 = std::operator<<(poVar3,(string *)&workload_name);
      poVar3 = std::operator<<(poVar3,"\' on CPU ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      std::operator<<(poVar3,"\n");
      pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
      uVar7 = uVar8 >> 1;
      local_98._M_data =
           inputs.
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar7;
      local_a0._M_data =
           results.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
           ._M_start + uVar7;
      std::thread::
      thread<std::function<void(std::vector<float,std::allocator<float>>const&,float&)>&,std::reference_wrapper<std::vector<float,std::allocator<float>>const>,std::reference_wrapper<float>,void>
                (&local_90,&func,&local_98,&local_a0);
      std::thread::operator=
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7,&local_90);
      std::thread::~thread(&local_90);
      bVar1 = true;
      pin_thread_to_cpu(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar7,iVar6);
    }
    else {
      bVar1 = std::operator==(&workload_name,"sin");
      __f = workload_sin;
      if (bVar1) goto LAB_001031b8;
      bVar1 = std::operator==(&workload_name,"accum");
      __f = workload_accum;
      if (bVar1) goto LAB_001031b8;
      bVar1 = std::operator==(&workload_name,"unrollaccum4");
      __f = workload_unrollaccum4;
      if (bVar1) goto LAB_001031b8;
      bVar1 = std::operator==(&workload_name,"unrollaccum8");
      __f = workload_unrollaccum8;
      if (bVar1) goto LAB_001031b8;
      bVar1 = std::operator==(&workload_name,"stdaccum");
      __f = workload_stdaccum;
      if (bVar1) goto LAB_001031b8;
      poVar3 = std::operator<<((ostream *)&std::cerr,"unknown workload: ");
      poVar3 = std::operator<<(poVar3,argv[uVar8]);
      std::operator<<(poVar3,"\n");
      bVar1 = false;
      local_fc = 1;
    }
    std::__cxx11::string::~string((string *)&workload_name);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    uVar8 = uVar8 + 2;
  } while (bVar1);
LAB_0010333b:
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&inputs);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&results.super__Vector_base<float,_std::allocator<float>_>);
  return local_fc;
LAB_00103320:
  for (; ptVar5 != threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish; ptVar5 = ptVar5 + 1) {
    std::thread::join();
  }
  local_fc = 0;
  goto LAB_0010333b;
}

Assistant:

int main(int argc, const char** argv) {
  // Set locale for comma-separation in large numbers.
  std::cout.imbue(std::locale(""));

  // Command-line invocation:
  //
  //  argv[0] is the program name
  //  argv[1] is workload name, with cpu number at argv[2]
  //  argv[3] is workload name, with cpu number at argv[4]
  //  ... etc.

  int num_workloads = argc / 2;
  std::vector<float> results(num_workloads);
  do_not_optimize(results.data());
  std::vector<std::thread> threads(num_workloads);

  constexpr size_t INPUT_SIZE = 100 * 1000 * 1000;
  auto t1 = hires_clock::now();

  // Allocate and initialize one extra input array - not used by any workload.
  // This makes sure none of the actual working inputs stays in L3 cache (which
  // is fairly sizable), giving one of the workloads an unfair advantage. The
  // lower cache layers are so small compared to the input size that their
  // pre-seeding advantage is negligible.
  std::vector<std::vector<float>> inputs(num_workloads + 1);
  for (int i = 0; i < num_workloads; ++i) {
    inputs[i] = make_input_array(INPUT_SIZE);
  }
  std::cout << "Created " << num_workloads + 1 << " input arrays"
            << "; elapsed: " << duration_ms(hires_clock::now() - t1).count()
            << " ms\n";

  for (int i = 1; i < argc; i += 2) {
    WorkloadFunc func;
    std::string workload_name = argv[i];
    if (workload_name == "fpchurn") {
      func = workload_fpchurn;
    } else if (workload_name == "sin") {
      func = workload_sin;
    } else if (workload_name == "accum") {
      func = workload_accum;
    } else if (workload_name == "unrollaccum4") {
      func = workload_unrollaccum4;
    } else if (workload_name == "unrollaccum8") {
      func = workload_unrollaccum8;
    } else if (workload_name == "stdaccum") {
      func = workload_stdaccum;
    } else {
      std::cerr << "unknown workload: " << argv[i] << "\n";
      return 1;
    }

    int cpu_num;
    if (i + 1 >= argc) {
      cpu_num = 0;
    } else {
      cpu_num = std::atoi(argv[i + 1]);
    }

    {
      std::lock_guard<std::mutex> iolock(iomutex);
      std::cout << "Spawning workload '" << workload_name << "' on CPU "
                << cpu_num << "\n";
    }

    int nworkload = i / 2;
    threads[nworkload] = std::thread(func, std::cref(inputs[nworkload]),
                                     std::ref(results[nworkload]));
    pin_thread_to_cpu(threads[nworkload], cpu_num);
  }

  // All the threads were launched in parallel in the loop above. Now wait for
  // all of them to finish.
  for (auto& t : threads) {
    t.join();
  }
  return 0;
}